

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

uint32_t get_number(char *prompt,uint32_t lbound,uint32_t ubound)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  char local_68 [8];
  char str [64];
  uint32_t n;
  uint32_t ubound_local;
  uint32_t lbound_local;
  char *prompt_local;
  
  while( true ) {
    while( true ) {
      printf("%s",prompt);
      pcVar3 = fgets(local_68,0x40,_stdin);
      if (pcVar3 == (char *)0x0) {
        printf("\n");
        return 0xffffffff;
      }
      if ((local_68[0] != '\n') && (iVar1 = __isoc99_sscanf(local_68,"%u",str + 0x3c), iVar1 != 0))
      break;
      printf("Invalid number!\n");
    }
    if ((lbound <= (uint)str._60_4_) && ((uint)str._60_4_ <= ubound)) break;
    printf("The number should be within %d and %d!\n",(ulong)lbound,(ulong)ubound);
  }
  uVar2._0_1_ = str[0x3c];
  uVar2._1_1_ = str[0x3d];
  uVar2._2_1_ = str[0x3e];
  uVar2._3_1_ = str[0x3f];
  return uVar2;
}

Assistant:

uint32_t get_number(const char* prompt, const uint32_t lbound, const uint32_t ubound) {
  uint32_t n;
  char str[64];
  while (true) {
    printf("%s", prompt);

    if (fgets(str, sizeof str, stdin) == NULL) {
      printf("\n");
      return UINT32_MAX;
    }

    if (*str != '\n' && sscanf(str, "%" SCNu32, &n)) {
      if (n < lbound || n > ubound) {
        printf("The number should be within %d and %d!\n", lbound, ubound);
      } else return n;
    } else {
      printf("Invalid number!\n");
    }
  }
}